

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O1

bool __thiscall rcg::System::isCharEncodingASCII(System *this)

{
  recursive_mutex *__mutex;
  element_type *peVar1;
  int iVar2;
  undefined8 uVar3;
  int32_t v;
  INFO_DATATYPE type;
  size_t size;
  int local_28;
  int local_24;
  size_t local_20;
  
  __mutex = &this->mtx;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    local_20 = 4;
    peVar1 = (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (this->tl == (TL_HANDLE)0x0) {
      iVar2 = (*peVar1->GCGetInfo)(8,&local_24,&local_28,&local_20);
    }
    else {
      iVar2 = (*peVar1->TLGetInfo)(this->tl,8,&local_24,&local_28,&local_20);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return local_28 == 0 || (local_24 != 5 || iVar2 != 0);
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

bool System::isCharEncodingASCII()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  bool ret=true;

  GenTL::INFO_DATATYPE type;
  int32_t v;
  size_t size=sizeof(v);
  GenTL::GC_ERROR err=GenTL::GC_ERR_SUCCESS;

  if (tl != 0)
  {
    err=gentl->TLGetInfo(tl, GenTL::TL_INFO_CHAR_ENCODING, &type, &v, &size);
  }
  else
  {
    err=gentl->GCGetInfo(GenTL::TL_INFO_CHAR_ENCODING, &type, &v, &size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_INT32 &&
      v != GenTL::TL_CHAR_ENCODING_ASCII)
  {
    ret=false;
  }

  return ret;
}